

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUTF8Transcoder.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::XMLUTF8Transcoder::transcodeTo
          (XMLUTF8Transcoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts options)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  XMLByte *pXVar3;
  TranscodingException *this_00;
  uint toFormat;
  uint uVar4;
  long lVar5;
  XMLCh *pXVar6;
  XMLCh tmpBuf [17];
  
  if (maxBytes == 0 || srcCount == 0) {
    XVar2 = 0;
  }
  else {
    pXVar3 = toFill;
    for (pXVar6 = srcData; pXVar6 < srcData + srcCount; pXVar6 = pXVar6 + lVar5) {
      XVar1 = *pXVar6;
      toFormat = (uint)(ushort)XVar1;
      lVar5 = 1;
      if ((XVar1 & 0xfc00U) == 0xd800) {
        if (srcData + srcCount <= pXVar6 + 1) break;
        toFormat = (uint)(ushort)XVar1 * 0x400 + (uint)(ushort)pXVar6[1] + 0xfca02400;
        lVar5 = 2;
      }
      uVar4 = 1;
      if ((((toFormat < 0x80) || (uVar4 = 2, toFormat < 0x800)) || (uVar4 = 3, toFormat < 0x10000))
         || (uVar4 = 4, toFormat < 0x110000)) {
        if (pXVar3 + uVar4 <= toFill + maxBytes) {
          XVar2 = (*(code *)((long)&DAT_00346bc0 + (long)(int)(&DAT_00346bc0)[uVar4 - 1]))();
          return XVar2;
        }
        break;
      }
      if (options == UnRep_Throw) {
        XMLString::binToText(toFormat,tmpBuf,0x10,0x10,(this->super_XMLTranscoder).fMemoryManager);
        this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUTF8Transcoder.cpp"
                   ,0x1f0,Trans_Unrepresentable,tmpBuf,(this->super_XMLTranscoder).fEncodingName,
                   (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLTranscoder).fMemoryManager);
        __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
      }
      *pXVar3 = ' ';
      pXVar3 = pXVar3 + 1;
    }
    *charsEaten = (long)pXVar6 - (long)srcData >> 1;
    XVar2 = (long)pXVar3 - (long)toFill;
  }
  return XVar2;
}

Assistant:

XMLSize_t
XMLUTF8Transcoder::transcodeTo( const   XMLCh* const    srcData
                                , const XMLSize_t       srcCount
                                ,       XMLByte* const  toFill
                                , const XMLSize_t       maxBytes
                                ,       XMLSize_t&      charsEaten
                                , const UnRepOpts       options)
{
    // Watch for pathological scenario. Shouldn't happen, but...
    if (!srcCount || !maxBytes)
        return 0;

    //
    //  Get pointers to our start and end points of the input and output
    //  buffers.
    //
    const XMLCh*    srcPtr = srcData;
    const XMLCh*    srcEnd = srcPtr + srcCount;
    XMLByte*        outPtr = toFill;
    XMLByte*        outEnd = toFill + maxBytes;

    while (srcPtr < srcEnd)
    {
        //
        //  Tentatively get the next char out. We have to get it into a
        //  32 bit value, because it could be a surrogate pair.
        //
        XMLUInt32 curVal = *srcPtr;

        //
        //  If its a leading surrogate, then lets see if we have the trailing
        //  available. If not, then give up now and leave it for next time.
        //
        unsigned int srcUsed = 1;
        if ((curVal >= 0xD800) && (curVal <= 0xDBFF))
        {
            if (srcPtr + 1 >= srcEnd)
                break;

            // Create the composite surrogate pair
            curVal = ((curVal - 0xD800) << 10)
                    + ((*(srcPtr + 1) - 0xDC00) + 0x10000);

            // And indicate that we ate another one
            srcUsed++;
        }

        // Figure out how many bytes we need
        unsigned int encodedBytes;
        if (curVal < 0x80)
            encodedBytes = 1;
        else if (curVal < 0x800)
            encodedBytes = 2;
        else if (curVal < 0x10000)
            encodedBytes = 3;
        else if (curVal < 0x110000)
            encodedBytes = 4;
        else
        {
            // If the options say to throw, then throw
            if (options == UnRep_Throw)
            {
                XMLCh tmpBuf[17];
                XMLString::binToText(curVal, tmpBuf, 16, 16, getMemoryManager());
                ThrowXMLwithMemMgr2
                (
                    TranscodingException
                    , XMLExcepts::Trans_Unrepresentable
                    , tmpBuf
                    , getEncodingName()
                    , getMemoryManager()
                );
            }

            // Else, use the replacement character
            *outPtr++ = chSpace;
            srcPtr += srcUsed;
            continue;
        }

        //
        //  If we cannot fully get this char into the output buffer,
        //  then leave it for the next time.
        //
        if (outPtr + encodedBytes > outEnd)
            break;

        // We can do it, so update the source index
        srcPtr += srcUsed;

        //
        //  And spit out the bytes. We spit them out in reverse order
        //  here, so bump up the output pointer and work down as we go.
        //
        outPtr += encodedBytes;
        switch(encodedBytes)
        {
            case 6 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 5 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 4 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 3 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 2 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 1 : *--outPtr = XMLByte
                     (
                        curVal | gFirstByteMark[encodedBytes]
                     );
        }

        // Add the encoded bytes back in again to indicate we've eaten them
        outPtr += encodedBytes;
    }

    // Fill in the chars we ate
    charsEaten = (srcPtr - srcData);

    // And return the bytes we filled in
    return (outPtr - toFill);
}